

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateNoExcept
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errorCodes,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,CommandFlavourFlags flavourFlags,bool vectorSizeCheck,bool raii)

{
  bool bVar1;
  char *local_98;
  char *local_90;
  allocator<char> local_4a [2];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_48;
  CommandFlavourFlagBits local_3b;
  byte local_3a;
  byte local_39;
  bool raii_local;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *pmStack_38;
  bool vectorSizeCheck_local;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *vectorParams_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errorCodes_local;
  VulkanHppGenerator *this_local;
  string *psStack_10;
  CommandFlavourFlags flavourFlags_local;
  
  local_39 = vectorSizeCheck;
  local_3a = raii;
  pmStack_38 = vectorParams;
  vectorParams_local =
       (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        *)returnParams;
  returnParams_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)errorCodes;
  errorCodes_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local._7_1_ = flavourFlags.m_mask;
  psStack_10 = __return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(errorCodes);
  if (bVar1) {
    local_3b = singular;
    bVar1 = Flags<CommandFlavourFlagBits>::operator&
                      ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_3b);
    if ((!bVar1) &&
       (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           vectorParams_local), !bVar1)) {
      local_48 = pmStack_38;
      bVar1 = std::ranges::__none_of_fn::
              operator()<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:8559:72)>
                        ((__none_of_fn *)&std::ranges::none_of,vectorParams_local,pmStack_38);
      if (!bVar1) goto LAB_0015b0cd;
    }
    if ((local_39 & 1) == 0) {
      local_90 = " VULKAN_HPP_NOEXCEPT";
    }
    else {
      local_90 = " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS";
      if ((local_3a & 1) != 0) {
        local_90 = "";
      }
    }
    local_98 = local_90;
  }
  else {
LAB_0015b0cd:
    local_98 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_98,local_4a);
  std::allocator<char>::~allocator(local_4a);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateNoExcept( std::vector<std::string> const &          errorCodes,
                                                  std::vector<size_t> const &               returnParams,
                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      vectorSizeCheck,
                                                  bool                                      raii ) const
{
  // noexcept is only possible with no error codes, and the return param (if any) is not a vector param (unless it's the singular version)
  return ( errorCodes.empty() && ( ( flavourFlags & CommandFlavourFlagBits::singular ) || returnParams.empty() ||
                                   std::ranges::none_of( returnParams, [&vectorParams]( size_t rp ) { return vectorParams.contains( rp ); } ) ) )
         ? ( vectorSizeCheck ? ( raii ? "" : " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS" ) : " VULKAN_HPP_NOEXCEPT" )
         : "";
}